

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

JDIMENSION get_pixel_rows(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int iVar1;
  undefined1 *puVar2;
  long in_RSI;
  long in_RDI;
  JSAMPARRAY colormap;
  JDIMENSION col;
  JSAMPROW ptr;
  int c;
  gif_source_ptr source;
  gif_source_ptr sinfo_00;
  int local_2c;
  undefined1 *local_28;
  
  sinfo_00 = *(gif_source_ptr *)(in_RSI + 0x38);
  local_28 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  for (local_2c = *(int *)(in_RDI + 0x30); local_2c != 0; local_2c = local_2c + -1) {
    iVar1 = LZWReadByte(sinfo_00);
    *local_28 = (sinfo_00->pub).start_input[iVar1];
    puVar2 = local_28 + 2;
    local_28[1] = (sinfo_00->pub).get_pixel_rows[iVar1];
    local_28 = local_28 + 3;
    *puVar2 = (sinfo_00->pub).finish_input[iVar1];
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_pixel_rows(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register int c;
  register JSAMPROW ptr;
  register JDIMENSION col;
  register JSAMPARRAY colormap = source->colormap;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    c = LZWReadByte(source);
    *ptr++ = colormap[CM_RED][c];
    *ptr++ = colormap[CM_GREEN][c];
    *ptr++ = colormap[CM_BLUE][c];
  }
  return 1;
}